

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall kj::PathPtr::startsWith(PathPtr *this,PathPtr prefix)

{
  bool bVar1;
  ArrayPtr<const_kj::String> local_20;
  ArrayPtr<const_kj::String> local_10;
  
  local_20.size_ = prefix.parts.size_;
  local_20.ptr = prefix.parts.ptr;
  if ((this->parts).size_ < local_20.size_) {
    bVar1 = false;
  }
  else {
    local_10.ptr = (this->parts).ptr;
    local_10.size_ = local_20.size_;
    bVar1 = ArrayPtr<const_kj::String>::operator==(&local_10,&local_20);
  }
  return bVar1;
}

Assistant:

bool PathPtr::startsWith(PathPtr prefix) const {
  return parts.size() >= prefix.parts.size() &&
         parts.first(prefix.parts.size()) == prefix.parts;
}